

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O3

void __thiscall Refal2::CScanner::processingWord(CScanner *this,char c)

{
  if (((c != '_') && (0x19 < (byte)((c & 0xdfU) + 0xbf))) && (c != '-' && 9 < (byte)(c - 0x30U))) {
    (this->super_CParser).super_CDirectiveParser.super_CRuleParser.super_CQualifierParser.token.type
         = TT_Word;
    CParser::AddToken(&this->super_CParser);
    this->state = S_Initial;
    processing(this,c);
    return;
  }
  std::__cxx11::string::push_back((char)this + -0x50);
  return;
}

Assistant:

void CScanner::processingWord( char c )
{
	if( IsWordLetter( c ) ) {
		token.word += c;
	} else {
		addToken( TT_Word );
		state = S_Initial;
		processing( c );
	}
}